

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEseqFloatVisitor.cpp
# Opt level: O0

void __thiscall
IRT::CEseqFloatVisitor::Visit(CEseqFloatVisitor *this,CJumpConditionalStatement *statement)

{
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> uVar1;
  TLogicOperator TVar2;
  CExpression *pCVar3;
  pointer pCVar4;
  CJumpConditionalStatement *pCVar5;
  CEseqExpression *pCVar6;
  CSeqStatement *pCVar7;
  CStatement *pCVar8;
  long local_158;
  CEseqExpression *local_148;
  CEseqFloatVisitor local_120;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_100;
  undefined1 local_f2;
  undefined1 local_f1;
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_d0;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_c8;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_c0;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_b8;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_b0;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_a8;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_a0;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_98;
  undefined1 local_90 [24];
  unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_> local_78;
  undefined1 local_70 [16];
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_60;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_58;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_50;
  long local_48;
  CEseqExpression *rightEseq;
  CEseqExpression *leftEseq;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> right;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_20;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> left;
  CJumpConditionalStatement *statement_local;
  CEseqFloatVisitor *this_local;
  
  left._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
        )(__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
          )statement;
  pCVar3 = CJumpConditionalStatement::LeftOperand(statement);
  (**(pCVar3->super_IExpression).super_INode._vptr_INode)(pCVar3,this);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&local_20,&this->childExpression);
  pCVar3 = CJumpConditionalStatement::RightOperand
                     ((CJumpConditionalStatement *)
                      left._M_t.
                      super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                      .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl);
  (**(pCVar3->super_IExpression).super_INode._vptr_INode)(pCVar3,this);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            ((unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &leftEseq,&this->childExpression);
  pCVar4 = std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
           get(&local_20);
  if (pCVar4 == (pointer)0x0) {
    local_148 = (CEseqExpression *)0x0;
  }
  else {
    local_148 = (CEseqExpression *)
                __dynamic_cast(pCVar4,&CExpression::typeinfo,&CEseqExpression::typeinfo,0);
  }
  rightEseq = local_148;
  pCVar4 = std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
           get((unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &leftEseq);
  if (pCVar4 == (pointer)0x0) {
    local_158 = 0;
  }
  else {
    local_158 = __dynamic_cast(pCVar4,&CExpression::typeinfo,&CEseqExpression::typeinfo,0);
  }
  uVar1._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
       left._M_t.
       super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
       .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
  local_48 = local_158;
  if ((rightEseq == (CEseqExpression *)0x0) && (local_158 == 0)) {
    pCVar5 = (CJumpConditionalStatement *)operator_new(0x30);
    local_90[0xf] = 1;
    TVar2 = CJumpConditionalStatement::Operation
                      ((CJumpConditionalStatement *)
                       left._M_t.
                       super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                       .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_58,&local_20);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_60,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &leftEseq);
    CJumpConditionalStatement::TrueLabel
              ((CJumpConditionalStatement *)
               left._M_t.
               super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
               .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl);
    CLabelStatement::CastCopy((CLabelStatement *)local_70);
    std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
    unique_ptr((unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                *)(local_70 + 8),
               (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                *)local_70);
    CJumpConditionalStatement::FalseLabel
              ((CJumpConditionalStatement *)
               left._M_t.
               super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
               .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl);
    CLabelStatement::CastCopy((CLabelStatement *)(local_90 + 0x10));
    std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
    unique_ptr(&local_78,
               (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                *)(local_90 + 0x10));
    CJumpConditionalStatement::CJumpConditionalStatement
              (pCVar5,TVar2,&local_58,&local_60,
               (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                *)(local_70 + 8),&local_78);
    local_90[0xf] = 0;
    std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
    unique_ptr<std::default_delete<IRT::CStatement_const>,void>
              ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
               &local_50,(pointer)pCVar5);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::operator=
              (&this->childStatement,&local_50);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_50);
    std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
    ~unique_ptr(&local_78);
    std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
    ~unique_ptr((unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                 *)(local_90 + 0x10));
    std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
    ~unique_ptr((unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                 *)(local_70 + 8));
    std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
    ~unique_ptr((unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                 *)local_70);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_60);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_58);
    local_90._8_4_ = 1;
  }
  else if ((rightEseq == (CEseqExpression *)0x0) && (local_158 != 0)) {
    pCVar6 = (CEseqExpression *)
             std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
             get(&local_20);
    processRightEseqInCJump
              ((CEseqFloatVisitor *)local_90,(CJumpConditionalStatement *)this,
               (CExpression *)
               uVar1._M_t.
               super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
               .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl,pCVar6);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::operator=
              (&this->childStatement,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               local_90);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              ((unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               local_90);
    local_90._8_4_ = 1;
  }
  else if ((rightEseq == (CEseqExpression *)0x0) || (local_158 != 0)) {
    if ((rightEseq == (CEseqExpression *)0x0) || (local_158 == 0)) {
      local_90._8_4_ = 0;
    }
    else {
      pCVar7 = (CSeqStatement *)operator_new(0x18);
      pCVar8 = CEseqExpression::getStatement(rightEseq);
      (*(pCVar8->super_IStatement).super_INode._vptr_INode[3])(&local_120.childExpression);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      unique_ptr((unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
                 &local_120.childExpressionList,
                 (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
                 &local_120.childExpression);
      uVar1 = left;
      pCVar6 = (CEseqExpression *)CEseqExpression::getExpression(rightEseq);
      processRightEseqInCJump
                (&local_120,(CJumpConditionalStatement *)this,
                 (CExpression *)
                 uVar1._M_t.
                 super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                 .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl,pCVar6);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      unique_ptr(&local_120.childStatement,
                 (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
                 &local_120);
      CSeqStatement::CSeqStatement
                (pCVar7,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                         *)&local_120.childExpressionList,&local_120.childStatement);
      std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
      unique_ptr<std::default_delete<IRT::CStatement_const>,void>
                ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
                 &local_100,(pointer)pCVar7);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::operator=
                (&this->childStatement,&local_100);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr(&local_100);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr(&local_120.childStatement);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr((unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
                  &local_120);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr((unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
                  &local_120.childExpressionList);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr((unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
                  &local_120.childExpression);
      local_90._8_4_ = 1;
    }
  }
  else {
    pCVar7 = (CSeqStatement *)operator_new(0x18);
    local_f2 = 1;
    pCVar8 = CEseqExpression::getStatement(rightEseq);
    (*(pCVar8->super_IStatement).super_INode._vptr_INode[3])(&local_a8);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              (&local_a0,&local_a8);
    pCVar5 = (CJumpConditionalStatement *)operator_new(0x30);
    local_f1 = 1;
    TVar2 = CJumpConditionalStatement::Operation
                      ((CJumpConditionalStatement *)
                       left._M_t.
                       super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                       .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl);
    pCVar3 = CEseqExpression::getExpression(rightEseq);
    (*(pCVar3->super_IExpression).super_INode._vptr_INode[3])(&local_c8);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_c0,&local_c8);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_d0,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &leftEseq);
    CJumpConditionalStatement::TrueLabel
              ((CJumpConditionalStatement *)
               left._M_t.
               super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
               .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl);
    CLabelStatement::CastCopy((CLabelStatement *)local_e0);
    std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
    unique_ptr((unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                *)(local_e0 + 8),
               (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                *)local_e0);
    CJumpConditionalStatement::FalseLabel
              ((CJumpConditionalStatement *)
               left._M_t.
               super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
               .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl);
    CLabelStatement::CastCopy((CLabelStatement *)local_f0);
    std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
    unique_ptr((unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                *)(local_f0 + 8),
               (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                *)local_f0);
    CJumpConditionalStatement::CJumpConditionalStatement
              (pCVar5,TVar2,&local_c0,&local_d0,
               (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                *)(local_e0 + 8),
               (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                *)(local_f0 + 8));
    local_f1 = 0;
    std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
    unique_ptr<std::default_delete<IRT::CStatement_const>,void>
              ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
               &local_b8,(pointer)pCVar5);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              (&local_b0,&local_b8);
    CSeqStatement::CSeqStatement(pCVar7,&local_a0,&local_b0);
    local_f2 = 0;
    std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
    unique_ptr<std::default_delete<IRT::CStatement_const>,void>
              ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
               &local_98,(pointer)pCVar7);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::operator=
              (&this->childStatement,&local_98);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_98);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_b0);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_b8);
    std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
    ~unique_ptr((unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                 *)(local_f0 + 8));
    std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
    ~unique_ptr((unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                 *)local_f0);
    std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
    ~unique_ptr((unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                 *)(local_e0 + 8));
    std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
    ~unique_ptr((unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                 *)local_e0);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_d0);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_c0);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_c8);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_a0);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_a8);
    local_90._8_4_ = 1;
  }
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            ((unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &leftEseq);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_20);
  return;
}

Assistant:

void IRT::CEseqFloatVisitor::Visit(const IRT::CJumpConditionalStatement &statement) {
    statement.LeftOperand()->Accept(*this);
    std::unique_ptr<const CExpression> left = std::move(childExpression);

    statement.RightOperand()->Accept(*this);
    std::unique_ptr<const CExpression> right = std::move(childExpression);

    const CEseqExpression* leftEseq = CAST_TO_ESEQ(left.get());
    const CEseqExpression* rightEseq = CAST_TO_ESEQ(right.get());

    if (leftEseq == nullptr && rightEseq == nullptr) {
        childStatement = SMOVE_UNIQ(new CJumpConditionalStatement(
                statement.Operation(),
                std::move(left),
                std::move(right),
                std::move(statement.TrueLabel()->CastCopy()),
                std::move(statement.FalseLabel()->CastCopy())
        ));

        return;
    }

    if (leftEseq == nullptr && rightEseq != nullptr) {
        childStatement = std::move(processRightEseqInCJump(&statement, left.get(), rightEseq));
        return;
    }

    if (leftEseq != nullptr && rightEseq == nullptr) {
        childStatement = SMOVE_UNIQ(new CSeqStatement(
                std::move(leftEseq->getStatement()->Copy()),
                SMOVE_UNIQ(new CJumpConditionalStatement(
                        statement.Operation(),
                        std::move(leftEseq->getExpression()->Copy()),
                        std::move(right),
                        std::move(statement.TrueLabel()->CastCopy()),
                        std::move(statement.FalseLabel()->CastCopy())
                ))
        ));
        return;
    }

    if (leftEseq != nullptr && rightEseq != nullptr) {
        childStatement = SMOVE_UNIQ(new CSeqStatement(
                std::move(leftEseq->getStatement()->Copy()),
                std::move(processRightEseqInCJump(&statement, leftEseq->getExpression(), rightEseq))
        ));

        return;
    }
}